

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  int *piVar17;
  Allocator *pAVar18;
  int iVar19;
  ulong uVar20;
  undefined4 *puVar21;
  long lVar22;
  long lVar23;
  void *pvVar24;
  long lVar25;
  long lVar26;
  void *pvVar27;
  void *pvVar28;
  undefined4 *puVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  void *pvVar33;
  long lVar34;
  void *pvVar35;
  ulong uVar36;
  void *pvVar37;
  void *pvVar38;
  int iVar39;
  uint _c;
  void *pvVar40;
  void *pvVar41;
  void *local_170;
  ulong local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  
  if ((this->super_LSTM).int8_scale_term == 0) {
    _c = ((this->super_LSTM).direction == 2) + 1;
    uVar20 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
    iVar1 = (this->super_LSTM).hidden_size;
    iVar19 = (int)((long)((ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff) /
                  (long)iVar1);
    iVar39 = iVar19 + 3;
    if (-1 < iVar19) {
      iVar39 = iVar19;
    }
    Mat::create(&this->weight_xc_data_packed,iVar39 >> 2,iVar1,_c,0x10,4,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,(this->super_LSTM).hidden_size,1,_c,0x10,4,
                (Allocator *)0x0);
    local_168 = 0;
    Mat::create(&this->weight_hc_data_packed,(this->super_LSTM).num_output,
                (this->super_LSTM).hidden_size,_c,0x10,4,(Allocator *)0x0);
    local_128 = (this->super_LSTM).weight_xc_data.data;
    sVar5 = (this->super_LSTM).weight_xc_data.elemsize;
    sVar6 = (this->super_LSTM).bias_c_data.elemsize;
    sVar7 = (this->super_LSTM).bias_c_data.cstep;
    iVar1 = (this->weight_xc_data_packed).w;
    sVar8 = (this->weight_xc_data_packed).elemsize;
    sVar9 = (this->weight_xc_data_packed).cstep;
    sVar10 = (this->bias_c_data_packed).cstep;
    sVar11 = (this->bias_c_data_packed).elemsize;
    iVar2 = (this->weight_hc_data_packed).w;
    sVar12 = (this->weight_hc_data_packed).elemsize;
    lVar34 = (long)(this->super_LSTM).bias_c_data.w * sVar6;
    uVar3 = (this->super_LSTM).hidden_size;
    uVar20 = (ulong)uVar3;
    lVar30 = (long)(this->super_LSTM).weight_xc_data.w * sVar5;
    local_140 = (void *)(lVar30 * (ulong)(uVar3 * 3) + (long)local_128);
    lVar32 = sVar5 * (this->super_LSTM).weight_xc_data.cstep;
    sVar5 = (this->weight_hc_data_packed).cstep;
    local_148 = (void *)(lVar30 * (ulong)(uVar3 * 2) + (long)local_128);
    local_150 = (void *)(lVar30 * uVar20 + (long)local_128);
    sVar13 = (this->super_LSTM).weight_hc_data.elemsize;
    lVar23 = (long)(this->super_LSTM).weight_hc_data.w * sVar13;
    local_158 = (this->super_LSTM).weight_hc_data.data;
    local_138 = (void *)((ulong)(uVar3 * 3) * lVar23 + (long)local_158);
    lVar25 = sVar13 * (this->super_LSTM).weight_hc_data.cstep;
    local_130 = (void *)((ulong)(uVar3 * 2) * lVar23 + (long)local_158);
    local_160 = (void *)(lVar23 * uVar20 + (long)local_158);
    uVar4 = (this->super_LSTM).num_output;
    pvVar14 = (this->super_LSTM).bias_c_data.data;
    pvVar15 = (this->weight_xc_data_packed).data;
    pvVar16 = (this->bias_c_data_packed).data;
    local_170 = (this->weight_hc_data_packed).data;
    do {
      if (0 < (int)uVar3) {
        lVar26 = sVar7 * sVar6 * local_168;
        puVar29 = (undefined4 *)(sVar10 * sVar11 * local_168 + (long)pvVar16);
        uVar36 = 0;
        pvVar24 = local_140;
        pvVar27 = local_148;
        pvVar28 = local_138;
        pvVar33 = local_170;
        pvVar35 = local_128;
        pvVar37 = local_160;
        pvVar38 = local_158;
        pvVar40 = local_130;
        pvVar41 = local_150;
        do {
          *puVar29 = *(undefined4 *)((long)pvVar14 + uVar36 * 4 + lVar26);
          puVar29[1] = *(undefined4 *)((long)pvVar14 + uVar36 * 4 + lVar34 + lVar26);
          puVar29[2] = *(undefined4 *)((long)pvVar14 + uVar36 * 4 + lVar34 * 2 + lVar26);
          puVar29[3] = *(undefined4 *)((long)pvVar14 + uVar36 * 4 + lVar34 * 3 + lVar26);
          if (3 < iVar19) {
            puVar21 = (undefined4 *)
                      ((long)pvVar15 + (long)iVar1 * sVar8 * uVar36 + sVar9 * sVar8 * local_168);
            uVar31 = 0;
            do {
              *puVar21 = *(undefined4 *)((long)pvVar35 + uVar31 * 4);
              puVar21[1] = *(undefined4 *)((long)pvVar41 + uVar31 * 4);
              puVar21[2] = *(undefined4 *)((long)pvVar27 + uVar31 * 4);
              puVar21[3] = *(undefined4 *)((long)pvVar24 + uVar31 * 4);
              puVar21 = puVar21 + 4;
              uVar31 = uVar31 + 1;
            } while ((uint)(iVar39 >> 2) != uVar31);
          }
          if (0 < (int)uVar4) {
            lVar22 = 0;
            do {
              *(undefined4 *)((long)pvVar33 + lVar22 * 4) = *(undefined4 *)((long)pvVar38 + lVar22);
              *(undefined4 *)((long)pvVar33 + lVar22 * 4 + 4) =
                   *(undefined4 *)((long)pvVar37 + lVar22);
              *(undefined4 *)((long)pvVar33 + lVar22 * 4 + 8) =
                   *(undefined4 *)((long)pvVar40 + lVar22);
              *(undefined4 *)((long)pvVar33 + lVar22 * 4 + 0xc) =
                   *(undefined4 *)((long)pvVar28 + lVar22);
              lVar22 = lVar22 + 4;
            } while ((ulong)uVar4 << 2 != lVar22);
          }
          puVar29 = puVar29 + 4;
          uVar36 = uVar36 + 1;
          pvVar24 = (void *)((long)pvVar24 + lVar30);
          pvVar27 = (void *)((long)pvVar27 + lVar30);
          pvVar41 = (void *)((long)pvVar41 + lVar30);
          pvVar35 = (void *)((long)pvVar35 + lVar30);
          pvVar28 = (void *)((long)pvVar28 + lVar23);
          pvVar40 = (void *)((long)pvVar40 + lVar23);
          pvVar37 = (void *)((long)pvVar37 + lVar23);
          pvVar38 = (void *)((long)pvVar38 + lVar23);
          pvVar33 = (void *)((long)pvVar33 + (long)iVar2 * sVar12);
        } while (uVar36 != uVar20);
      }
      local_168 = local_168 + 1;
      local_140 = (void *)((long)local_140 + lVar32);
      local_148 = (void *)((long)local_148 + lVar32);
      local_150 = (void *)((long)local_150 + lVar32);
      local_128 = (void *)((long)local_128 + lVar32);
      local_138 = (void *)((long)local_138 + lVar25);
      local_130 = (void *)((long)local_130 + lVar25);
      local_160 = (void *)((long)local_160 + lVar25);
      local_158 = (void *)((long)local_158 + lVar25);
      local_170 = (void *)((long)local_170 + sVar5 * sVar12);
    } while (local_168 != _c);
    if (opt->lightmode != false) {
      piVar17 = (this->super_LSTM).weight_xc_data.refcount;
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          pvVar14 = (this->super_LSTM).weight_xc_data.data;
          pAVar18 = (this->super_LSTM).weight_xc_data.allocator;
          if (pAVar18 == (Allocator *)0x0) {
            if (pvVar14 != (void *)0x0) {
              free(pvVar14);
            }
          }
          else {
            (*pAVar18->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_xc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_xc_data.data = (void *)0x0;
      (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_xc_data.dims = 0;
      (this->super_LSTM).weight_xc_data.w = 0;
      (this->super_LSTM).weight_xc_data.h = 0;
      (this->super_LSTM).weight_xc_data.d = 0;
      (this->super_LSTM).weight_xc_data.c = 0;
      piVar17 = (this->super_LSTM).bias_c_data.refcount;
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          pvVar14 = (this->super_LSTM).bias_c_data.data;
          pAVar18 = (this->super_LSTM).bias_c_data.allocator;
          if (pAVar18 == (Allocator *)0x0) {
            if (pvVar14 != (void *)0x0) {
              free(pvVar14);
            }
          }
          else {
            (*pAVar18->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).bias_c_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
      (this->super_LSTM).bias_c_data.data = (void *)0x0;
      (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
      (this->super_LSTM).bias_c_data.dims = 0;
      (this->super_LSTM).bias_c_data.w = 0;
      (this->super_LSTM).bias_c_data.h = 0;
      (this->super_LSTM).bias_c_data.d = 0;
      (this->super_LSTM).bias_c_data.c = 0;
      piVar17 = (this->super_LSTM).weight_hc_data.refcount;
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          pvVar14 = (this->super_LSTM).weight_hc_data.data;
          pAVar18 = (this->super_LSTM).weight_hc_data.allocator;
          if (pAVar18 == (Allocator *)0x0) {
            if (pvVar14 != (void *)0x0) {
              free(pvVar14);
            }
          }
          else {
            (*pAVar18->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_LSTM).weight_hc_data.cstep = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
      *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
      (this->super_LSTM).weight_hc_data.data = (void *)0x0;
      (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
      (this->super_LSTM).weight_hc_data.dims = 0;
      (this->super_LSTM).weight_hc_data.w = 0;
      (this->super_LSTM).weight_hc_data.h = 0;
      (this->super_LSTM).weight_hc_data.d = 0;
      (this->super_LSTM).weight_hc_data.c = 0;
    }
  }
  else {
    create_pipeline_int8(this,opt);
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}